

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::EOR_AB_X(CPU *this)

{
  byte bVar1;
  byte bVar2;
  uint16_t uVar3;
  byte bVar4;
  
  this->cycles = 4;
  uVar3 = GetWord(this);
  bVar2 = ReadByte(this,this->X + uVar3);
  bVar1 = this->A;
  bVar4 = bVar1 ^ bVar2;
  this->A = bVar4;
  (this->field_6).ps = bVar4 & 0x80 | (bVar1 == bVar2) * '\x02' | (this->field_6).ps & 0x7d;
  return;
}

Assistant:

void CPU::EOR_AB_X()
{
    cycles = 4;
    uint16_t address = GetWord();
    A ^= ReadByte(address + X);
    Z = (A == 0);
    N = (A & 0b10000000) > 0;
}